

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O1

TermList ApplicativeHelper::createAppTerm(TermList sort,TermList head,TermStack *terms)

{
  TermList s2;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  TermList res;
  long lVar4;
  long lVar5;
  
  uVar2 = (int)((ulong)((long)terms->_cursor - (long)terms->_stack) >> 3) - 1;
  if (-1 < (int)uVar2) {
    lVar4 = (ulong)uVar2 + 1;
    do {
      uVar3 = (ulong)(*(uint *)(sort._content + 0xc) & 0xfffffff);
      s2._content = *(uint64_t *)(sort._content + 0x20 + uVar3 * 8);
      head = createAppTerm(*(uint64_t *)(sort._content + 0x28 + uVar3 * 8),s2,head,
                           terms->_stack[lVar4 + -1]._content,true);
      lVar5 = lVar4 + -1;
      bVar1 = 0 < lVar4;
      sort._content = s2._content;
      lVar4 = lVar5;
    } while (lVar5 != 0 && bVar1);
  }
  return (TermList)head._content;
}

Assistant:

TermList ApplicativeHelper::createAppTerm(TermList sort, TermList head, TermStack& terms)
{
  ASS(head.isVar() || SortHelper::getResultSort(head.term()) == sort);

  TermList res = head;
  TermList s1, s2;
  
  for(int i = terms.size() - 1; i >= 0; i--){
    s1 = getNthArg(sort, 1);
    s2 = getResultApplieadToNArgs(sort, 1);
    res = createAppTerm(s1, s2, res, terms[i]);
    sort = s2;
  }
  return res; 

}